

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

int __thiscall
CVmObjGramProd::getp_parse(CVmObjGramProd *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  CVmObjPageEntry *this_00;
  long *plVar1;
  long lVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  vm_val_t *pvVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  vm_obj_id_t vVar10;
  vmgramprod_tok *tok;
  ulong uVar11;
  ushort *puVar12;
  ushort *valstr;
  vmgram_match_info *__dest;
  CVmGramProdMatchEntry *pCVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  uint uVar19;
  vmgramprod_tok *pvVar20;
  vm_val_t *this_01;
  ulong uVar21;
  uint uVar22;
  CVmGramProdMatchEntry *pCVar23;
  enum_props_ctx ctx;
  CVmObjDict *local_b8;
  vm_val_t ele_val;
  vm_val_t tok_str_val;
  vm_val_t tok_typ_val;
  CVmGramProdQueue queues;
  
  if (argc == (uint *)0x0) {
    uVar19 = 0;
  }
  else {
    uVar19 = *argc;
  }
  if (getp_parse(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_parse();
  }
  iVar7 = CVmObject::get_prop_check_argc(retval,argc,&getp_parse::desc);
  if (iVar7 != 0) {
    return 1;
  }
  plVar1 = *(long **)((this->super_CVmObject).ext_ + 0x18);
  lVar2 = *plVar1;
  lVar15 = lVar2 + 8;
  plVar1[1] = lVar2;
  if (lVar2 == 0) {
    lVar15 = 0;
  }
  plVar1[3] = (ulong)(lVar2 != 0) << 0xe;
  plVar1[2] = lVar15;
  queues.work_queue_ = (CVmGramProdState *)0x0;
  queues.badness_queue_ = (CVmGramProdState *)0x0;
  queues.success_list_ = (CVmGramProdMatchEntry *)0x0;
  this_01 = sp_ + -1;
  iVar7 = vm_val_t::is_listlike(this_01);
  if ((iVar7 == 0) || (uVar8 = vm_val_t::ll_length(this_01), (int)uVar8 < 0)) {
    err_throw(0x7e4);
  }
  if (1 < (int)uVar19) {
    if ((sp_[-2].typ & ~VM_CODEPTR) != VM_NIL) {
      err_throw(0x7da);
    }
    if (sp_[-2].typ != VM_NIL) {
      uVar22 = sp_[-2].val.obj >> 0xc;
      uVar9 = sp_[-2].val.obj & 0xfff;
      iVar7 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar22][uVar9].ptr_ + 8))
                        (G_obj_table_X.pages_[uVar22] + uVar9,CVmObjDict::metaclass_reg_);
      if (iVar7 == 0) {
        err_throw(0x7e6);
      }
      local_b8 = (CVmObjDict *)((long)&G_obj_table_X.pages_[uVar22]->ptr_ + (ulong)(uVar9 * 0x18));
      goto LAB_0025e30c;
    }
  }
  local_b8 = (CVmObjDict *)0x0;
LAB_0025e30c:
  uVar17 = (ulong)uVar8;
  tok = (vmgramprod_tok *)
        CVmGramProdMem::alloc(*(CVmGramProdMem **)((this->super_CVmObject).ext_ + 0x18),uVar17 << 6)
  ;
  if (uVar8 != 0) {
    uVar14 = 0;
    do {
      uVar21 = uVar14 + 1;
      tok[uVar14].match_cnt_ = 0;
      (&tok[uVar14].match_cnt_)[1] = 0;
      ctx.ext = (vm_gram_ext *)CONCAT44(ctx.ext._4_4_,7);
      ctx.cnt = CONCAT44(ctx.cnt._4_4_,(int)uVar21);
      vm_val_t::ll_index(this_01,&ele_val,(vm_val_t *)&ctx);
      iVar7 = vm_val_t::is_listlike(&ele_val);
      if ((iVar7 == 0) || (iVar7 = vm_val_t::ll_length(&ele_val), iVar7 < 0)) {
        err_throw(0x900);
      }
      pvVar20 = tok + uVar14;
      ctx.ext = (vm_gram_ext *)CONCAT44(ctx.ext._4_4_,7);
      ctx.cnt = CONCAT44(ctx.cnt._4_4_,1);
      vm_val_t::ll_index(&ele_val,&tok_str_val,(vm_val_t *)&ctx);
      ctx.ext = (vm_gram_ext *)CONCAT44(ctx.ext._4_4_,7);
      ctx.cnt = CONCAT44(ctx.cnt._4_4_,2);
      vm_val_t::ll_index(&ele_val,&tok_typ_val,(vm_val_t *)&ctx);
      uVar11 = (ulong)tok_typ_val.val.obj;
      if (tok_typ_val.typ != VM_ENUM) {
        uVar11 = 0;
      }
      pvVar20->typ_ = uVar11;
      puVar12 = (ushort *)vm_val_t::get_as_string(&tok_str_val);
      if (puVar12 == (ushort *)0x0) {
        pvVar20->txt_ = (char *)0x0;
        pvVar20->len_ = 0;
      }
      else {
        valstr = puVar12 + 1;
        (pvVar20->val_).typ = tok_str_val.typ;
        *(undefined4 *)&(pvVar20->val_).field_0x4 = tok_str_val._4_4_;
        (pvVar20->val_).val = tok_str_val.val;
        pvVar20->txt_ = (char *)valstr;
        pvVar20->len_ = (ulong)*puVar12;
        uVar14 = (ulong)*puVar12;
        if (local_b8 == (CVmObjDict *)0x0) {
          if (uVar14 == 0) {
            pvVar20->hash_ = 0;
          }
          else {
            uVar16 = 0;
            uVar8 = 0;
            do {
              uVar8 = uVar8 + *(byte *)((long)valstr + uVar16);
              uVar16 = uVar16 + 1;
            } while (uVar14 != uVar16);
            pvVar20->hash_ = uVar8;
          }
        }
        else {
          uVar8 = CVmObjDict::calc_str_hash(local_b8,&tok_str_val,(char *)valstr,uVar14);
          pvVar20->hash_ = uVar8;
          ctx.ext = (vm_gram_ext *)(this->super_CVmObject).ext_;
          ctx.cnt = 0;
          CVmObjDict::enum_word_props
                    (local_b8,enum_props_cb,&ctx,&tok_str_val,pvVar20->txt_,pvVar20->len_);
          if (ctx.cnt != 0) {
            pvVar20->match_cnt_ = ctx.cnt;
            __dest = (vmgram_match_info *)
                     CVmGramProdMem::alloc
                               (*(CVmGramProdMem **)((this->super_CVmObject).ext_ + 0x18),
                                ctx.cnt * 2);
            pvVar20->matches_ = __dest;
            memcpy(__dest,*(void **)((this->super_CVmObject).ext_ + 0x20),ctx.cnt * 2);
          }
        }
      }
      uVar14 = uVar21;
    } while (uVar21 != uVar17);
  }
  sVar18 = 0;
  enqueue_alts(this,*(CVmGramProdMem **)((this->super_CVmObject).ext_ + 0x18),tok,uVar17,0,
               (CVmGramProdState *)0x0,&queues,self,0,(CVmGramProdMatch *)0x0,local_b8);
  process_work_queue(*(CVmGramProdMem **)((this->super_CVmObject).ext_ + 0x18),tok,uVar17,&queues,
                     local_b8);
  pCVar23 = queues.success_list_;
  if (queues.success_list_ != (CVmGramProdMatchEntry *)0x0) {
    sVar18 = 0;
    pCVar13 = queues.success_list_;
    do {
      pCVar13 = pCVar13->nxt_;
      sVar18 = sVar18 + 1;
    } while (pCVar13 != (CVmGramProdMatchEntry *)0x0);
  }
  vVar10 = CVmObjList::create(0,sVar18);
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar10;
  this_00 = G_obj_table_X.pages_[vVar10 >> 0xc] + (vVar10 & 0xfff);
  uVar17 = (ulong)**(ushort **)((long)&this_00->ptr_ + 8);
  if (uVar17 != 0) {
    CVmObjList::cons_clear((CVmObjList *)this_00,0,uVar17 - 1);
  }
  pvVar5 = sp_;
  uVar4 = *(undefined4 *)&retval->field_0x4;
  aVar3 = retval->val;
  sp_ = sp_ + 1;
  pvVar5->typ = retval->typ;
  *(undefined4 *)&pvVar5->field_0x4 = uVar4;
  pvVar5->val = aVar3;
  if (pCVar23 != (CVmGramProdMatchEntry *)0x0) {
    sVar18 = 0;
    do {
      ele_val.val.obj = CVmObjList::create(0,pCVar23->tok_pos_);
      pvVar5 = sp_;
      ele_val.typ = VM_OBJ;
      aVar3._4_4_ = ele_val.val._4_4_;
      aVar3.obj = ele_val.val.obj;
      pvVar6 = sp_ + 1;
      *(ulong *)sp_ = CONCAT44(ele_val._4_4_,5);
      sp_ = pvVar6;
      pvVar5->val = aVar3;
      uVar17 = (ulong)**(ushort **)
                        ((long)&G_obj_table_X.pages_[ele_val.val.obj >> 0xc]
                                [ele_val.val.obj & 0xfff].ptr_ + 8);
      if (uVar17 != 0) {
        CVmObjList::cons_clear
                  ((CVmObjList *)
                   (G_obj_table_X.pages_[ele_val.val.obj >> 0xc] + (ele_val.val.obj & 0xfff)),0,
                   uVar17 - 1);
      }
      build_match_tree(pCVar23->match_,this_01,&ele_val,(vm_val_t *)&ctx,(size_t *)&tok_typ_val,
                       (size_t *)&tok_str_val);
      sp_ = sp_ + -1;
      CVmObjList::cons_set_element((CVmObjList *)this_00,sVar18,(vm_val_t *)&ctx);
      sVar18 = sVar18 + 1;
      pCVar23 = pCVar23->nxt_;
    } while (pCVar23 != (CVmGramProdMatchEntry *)0x0);
  }
  sp_ = sp_ + (-1 - (long)(int)uVar19);
  return 1;
}

Assistant:

int CVmObjGramProd::getp_parse(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *argc)
{
    vm_val_t *tokval;
    vm_val_t dictval;
    CVmObjDict *dict;
    int tok_cnt;
    int i;
    vmgramprod_tok *tok;
    int orig_argc = (argc != 0 ? *argc : 0);
    CVmGramProdQueue queues;
    CVmObjList *lst;
    int succ_cnt;
    CVmGramProdMatchEntry *match;
    static CVmNativeCodeDesc desc(2);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* reset our memory pool */
    get_ext()->mem_->reset();

    /* clear the work queues */
    queues.clear();

    /* 
     *   get the tokenList argument and make sure it's a list; leave it on
     *   the stack for now so it remains reachable for the garbage
     *   collector 
     */
    tokval = G_stk->get(0);
    if (!tokval->is_listlike(vmg0_)
        || (tok_cnt = tokval->ll_length(vmg0_)) < 0)
        err_throw(VMERR_LIST_VAL_REQD);

    /* check for a dictionary argument */
    if (orig_argc >= 2)
    {
        /* get the dictionary argument */
        dictval = *G_stk->get(1);

        /* make sure it's an object or nil */
        if (dictval.typ != VM_OBJ && dictval.typ != VM_NIL)
            err_throw(VMERR_OBJ_VAL_REQD);
    }
    else
    {
        /* use a nil dictionary by default */
        dictval.set_nil();
    }

    /* get the dictionary object and check that it's really a dictionary */
    if (dictval.typ != VM_NIL)
    {
        /* if it's not a CVmObjDict object, it's the wrong type */
        if (!CVmObjDict::is_dictionary_obj(vmg_ dictval.val.obj))
        {
            /* wrong type - throw an error */
            err_throw(VMERR_INVAL_OBJ_TYPE);
        }

        /* get the VM object pointer */
        dict = (CVmObjDict *)vm_objp(vmg_ dictval.val.obj);
    }
    else
    {
        /* there's no dictionary object */
        dict = 0;
    }

    /* 
     *   For quick and easy access, make our own private copy of the token
     *   and type lists.  First, allocate an array of token structures.  
     */
    tok = (vmgramprod_tok *)get_ext()->mem_
          ->alloc(tok_cnt * sizeof(vmgramprod_tok));

    /* copy the token string references and types into our list */
    for (i = 0 ; i < tok_cnt ; ++i)
    {
        vm_val_t ele_val;
        vm_val_t tok_typ_val;
        vm_val_t tok_str_val;
        int subcnt;
        const char *tokstrp;

        /* presume we won't have any vocabulary properties for the word */
        tok[i].match_cnt_ = 0;
        tok[i].matches_ = 0;

        /* get this element from the list, and treat it as a list */
        tokval->ll_index(vmg_ &ele_val, i + 1);

        /* make sure the sub-val is a list */
        if (!ele_val.is_listlike(vmg0_)
            || (subcnt = ele_val.ll_length(vmg0_)) < 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* 
         *   parse the token sublist: the first element is the token value,
         *   and the second element is the token type 
         */
        ele_val.ll_index(vmg_ &tok_str_val, 1);
        ele_val.ll_index(vmg_ &tok_typ_val, 2);

        /* use the value if it's an enumerator; if not, use zero */
        if (tok_typ_val.typ == VM_ENUM)
            tok[i].typ_ = tok_typ_val.val.enumval;
        else
            tok[i].typ_ = 0;

        /* get the token value as a string */
        tokstrp = tok_str_val.get_as_string(vmg0_);

        /* if it's a string, copy it; otherwise, ignore the value */
        if (tokstrp != 0)
        {
            /* remember the string value */
            tok[i].val_ = tok_str_val;

            /* point the token to the string */
            tok[i].txt_ = tokstrp + VMB_LEN;
            tok[i].len_ = vmb_get_len(tokstrp);

            /* calculate and store the token's hash value */
            tok[i].hash_ = calc_str_hash(
                vmg_ dict, &tok_str_val,
                tokstrp + VMB_LEN, vmb_get_len(tokstrp));
            
            /* 
             *   if we have a dictionary, enumerate the properties
             *   associated with the word 
             */
            if (dict != 0)
            {
                enum_props_ctx ctx;
                
                /* set up our callback context */
                ctx.ext = get_ext();
                ctx.cnt = 0;
                
                /* enumerate the properties */
                dict->enum_word_props(vmg_ &enum_props_cb, &ctx,
                                      &tok_str_val, tok[i].txt_, tok[i].len_);
                
                /* 
                 *   if we found any properties for the word, make a copy
                 *   for the token list 
                 */
                if (ctx.cnt != 0)
                {
                    /* allocate space for the list */
                    tok[i].match_cnt_ = ctx.cnt;
                    tok[i].matches_ =
                        (vmgram_match_info *)get_ext()->mem_
                        ->alloc(ctx.cnt * sizeof(vmgram_match_info));
                    
                    /* copy the list */
                    memcpy(tok[i].matches_, get_ext()->prop_enum_arr_,
                           ctx.cnt * sizeof(tok[i].matches_[0]));
                }
            }
        }
        else
        {
            /* it's not a string - use a null string value for this token */
            tok[i].txt_ = 0;
            tok[i].len_ = 0;
        }
    }

    /* enqueue a match state item for each of our alternatives */
    enqueue_alts(vmg_ get_ext()->mem_, tok, tok_cnt, 0, 0,
                 &queues, self, FALSE, 0, dict);

    /* process the work queue */
    process_work_queue(vmg_ get_ext()->mem_, tok, tok_cnt,
                       &queues, dict);

    /* count the entries in the success list */
    for (succ_cnt = 0, match = queues.success_list_ ; match != 0 ;
         ++succ_cnt, match = match->nxt_) ;

    /* allocate the return list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, succ_cnt));
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* initially clear the elements of the return list to nil */
    lst->cons_clear();

    /* push the list momentarily to protect it from garbage collection */
    G_stk->push(retval);

    /* set the elements */
    for (succ_cnt = 0, match = queues.success_list_ ; match != 0 ;
         ++succ_cnt, match = match->nxt_)
    {
        vm_val_t tree_val;
        vm_val_t tok_match_val;
        size_t first_tok;
        size_t last_tok;
        
        /* 
         *   Create a list to hold the token match list - this is a list of
         *   the dictionary's comparator's matchValue() results for the
         *   tokens that matched literals in the grammar rule.  We need a
         *   list with one element per token that we matched.
         *   
         *   We can't actually populate this list yet, but all we need for
         *   the moment are references to it.  So, create the list; we'll
         *   fill it in as we traverse the match to build the result tree.  
         */
        tok_match_val.set_obj(
            CVmObjList::create(vmg_ FALSE, match->tok_pos_));

        /* push the token match value list for gc protection */
        G_stk->push(&tok_match_val);

        /* clear it out */
        ((CVmObjList *)vm_objp(vmg_ tok_match_val.val.obj))->cons_clear();

        /* build the object tree for this success object */
        build_match_tree(vmg_ match->match_, tokval, &tok_match_val,
                         &tree_val, &first_tok, &last_tok);

        /* discard our token match list's gc protection stack entry */
        G_stk->discard();

        /* 
         *   add the match tree's root object to the main return list (note
         *   that this protects it from garbage collection by virtue of the
         *   main return list being protected from garbage collection) 
         */
        lst->cons_set_element(succ_cnt, &tree_val);
    }

    /* discard the gc protection */
    G_stk->discard();

    /* discard arguments */
    G_stk->discard(orig_argc);

    /* evaluation successful */
    return TRUE;
}